

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O0

size_t FSE_readNCount(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,void *headerBuffer,
                     size_t hbSize)

{
  U32 UVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong in_RCX;
  uint *in_RDX;
  uint *in_RSI;
  long in_RDI;
  ulong in_R8;
  bool bVar5;
  uint symbNb;
  int count;
  int max;
  uint n0;
  int previous0;
  uint charnum;
  int bitCount;
  U32 bitStream;
  int threshold;
  int remaining;
  int nbBits;
  BYTE *ip;
  BYTE *iend;
  BYTE *istart;
  int in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint local_70;
  uint local_68;
  uint local_60;
  uint local_5c;
  uint local_58;
  int local_54;
  int local_50;
  int local_4c;
  ulong local_48;
  size_t local_8;
  
  lVar4 = in_RCX + in_R8;
  local_60 = 0;
  bVar5 = false;
  if (in_R8 < 4) {
    local_8 = 0xffffffffffffffb8;
  }
  else {
    UVar1 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    uVar2 = (UVar1 & 0xf) + 5;
    if (uVar2 < 0x10) {
      local_58 = UVar1 >> 4;
      local_5c = 4;
      *in_RDX = uVar2;
      local_50 = (1 << (sbyte)uVar2) + 1;
      local_54 = 1 << (sbyte)uVar2;
      local_4c = (UVar1 & 0xf) + 6;
      local_48 = in_RCX;
      while (1 < local_50 && local_60 <= *in_RSI) {
        if (bVar5) {
          local_68 = local_60;
          while ((local_58 & 0xffff) == 0xffff) {
            local_68 = local_68 + 0x18;
            if (local_48 < lVar4 - 5U) {
              local_48 = local_48 + 2;
              UVar1 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff8c,
                                                    in_stack_ffffffffffffff88));
              local_58 = UVar1 >> ((byte)local_5c & 0x1f);
            }
            else {
              local_58 = local_58 >> 0x10;
              local_5c = local_5c + 0x10;
            }
          }
          for (; (local_58 & 3) == 3; local_58 = local_58 >> 2) {
            local_68 = local_68 + 3;
            local_5c = local_5c + 2;
          }
          local_68 = (local_58 & 3) + local_68;
          local_5c = local_5c + 2;
          if (*in_RSI < local_68) {
            return 0xffffffffffffffd0;
          }
          while (local_60 < local_68) {
            *(undefined2 *)(in_RDI + (ulong)local_60 * 2) = 0;
            local_60 = local_60 + 1;
          }
          if ((lVar4 - 7U < local_48) && (lVar4 - 4U < local_48 + (long)((int)local_5c >> 3))) {
            local_58 = local_58 >> 2;
          }
          else {
            local_48 = local_48 + (long)((int)local_5c >> 3);
            local_5c = local_5c & 7;
            UVar1 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff8c,
                                                  in_stack_ffffffffffffff88));
            local_58 = UVar1 >> (sbyte)local_5c;
          }
        }
        uVar2 = (local_54 * 2 + -1) - local_50;
        if ((local_58 & local_54 - 1U) < uVar2) {
          local_70 = local_58 & local_54 - 1U;
          iVar3 = local_4c + -1;
        }
        else {
          local_70 = local_58 & local_54 * 2 - 1U;
          iVar3 = local_4c;
          if (local_54 <= (int)local_70) {
            local_70 = local_70 - uVar2;
          }
        }
        local_5c = iVar3 + local_5c;
        iVar3 = local_70 - 1;
        in_stack_ffffffffffffff88 = iVar3;
        if (iVar3 < 0) {
          in_stack_ffffffffffffff88 = -iVar3;
        }
        local_50 = local_50 - in_stack_ffffffffffffff88;
        *(short *)(in_RDI + (ulong)local_60 * 2) = (short)iVar3;
        bVar5 = iVar3 == 0;
        for (; local_50 < local_54; local_54 = local_54 >> 1) {
          local_4c = local_4c + -1;
        }
        if ((lVar4 - 7U < local_48) && (lVar4 - 4U < local_48 + (long)((int)local_5c >> 3))) {
          local_5c = local_5c + (((int)lVar4 + -4) - (int)local_48) * -8;
          local_48 = lVar4 - 4;
        }
        else {
          local_48 = local_48 + (long)((int)local_5c >> 3);
          local_5c = local_5c & 7;
        }
        UVar1 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        local_58 = UVar1 >> ((byte)local_5c & 0x1f);
        local_60 = local_60 + 1;
      }
      if (local_50 == 1) {
        uVar2 = local_60;
        if ((int)local_5c < 0x21) {
          for (; uVar2 <= *in_RSI; uVar2 = uVar2 + 1) {
            *(undefined2 *)(in_RDI + (ulong)uVar2 * 2) = 0;
          }
          *in_RSI = local_60 - 1;
          local_8 = (local_48 + (long)((int)(local_5c + 7) >> 3)) - in_RCX;
        }
        else {
          local_8 = 0xffffffffffffffec;
        }
      }
      else {
        local_8 = 0xffffffffffffffec;
      }
    }
    else {
      local_8 = 0xffffffffffffffd4;
    }
  }
  return local_8;
}

Assistant:

size_t FSE_readNCount (short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
                 const void* headerBuffer, size_t hbSize)
{
    const BYTE* const istart = (const BYTE*) headerBuffer;
    const BYTE* const iend = istart + hbSize;
    const BYTE* ip = istart;
    int nbBits;
    int remaining;
    int threshold;
    U32 bitStream;
    int bitCount;
    unsigned charnum = 0;
    int previous0 = 0;

    if (hbSize < 4) return ERROR(srcSize_wrong);
    bitStream = MEM_readLE32(ip);
    nbBits = (bitStream & 0xF) + FSE_MIN_TABLELOG;   /* extract tableLog */
    if (nbBits > FSE_TABLELOG_ABSOLUTE_MAX) return ERROR(tableLog_tooLarge);
    bitStream >>= 4;
    bitCount = 4;
    *tableLogPtr = nbBits;
    remaining = (1<<nbBits)+1;
    threshold = 1<<nbBits;
    nbBits++;

    while ((remaining>1) & (charnum<=*maxSVPtr)) {
        if (previous0) {
            unsigned n0 = charnum;
            while ((bitStream & 0xFFFF) == 0xFFFF) {
                n0 += 24;
                if (ip < iend-5) {
                    ip += 2;
                    bitStream = MEM_readLE32(ip) >> bitCount;
                } else {
                    bitStream >>= 16;
                    bitCount   += 16;
            }   }
            while ((bitStream & 3) == 3) {
                n0 += 3;
                bitStream >>= 2;
                bitCount += 2;
            }
            n0 += bitStream & 3;
            bitCount += 2;
            if (n0 > *maxSVPtr) return ERROR(maxSymbolValue_tooSmall);
            while (charnum < n0) normalizedCounter[charnum++] = 0;
            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                ip += bitCount>>3;
                bitCount &= 7;
                bitStream = MEM_readLE32(ip) >> bitCount;
            } else {
                bitStream >>= 2;
        }   }
        {   int const max = (2*threshold-1) - remaining;
            int count;

            if ((bitStream & (threshold-1)) < (U32)max) {
                count = bitStream & (threshold-1);
                bitCount += nbBits-1;
            } else {
                count = bitStream & (2*threshold-1);
                if (count >= threshold) count -= max;
                bitCount += nbBits;
            }

            count--;   /* extra accuracy */
            remaining -= count < 0 ? -count : count;   /* -1 means +1 */
            normalizedCounter[charnum++] = (short)count;
            previous0 = !count;
            while (remaining < threshold) {
                nbBits--;
                threshold >>= 1;
            }

            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                ip += bitCount>>3;
                bitCount &= 7;
            } else {
                bitCount -= (int)(8 * (iend - 4 - ip));
                ip = iend - 4;
            }
            bitStream = MEM_readLE32(ip) >> (bitCount & 31);
    }   }   /* while ((remaining>1) & (charnum<=*maxSVPtr)) */
    if (remaining != 1) return ERROR(corruption_detected);
    if (bitCount > 32) return ERROR(corruption_detected);
    /* zeroise the rest */
    {   unsigned symbNb = charnum;
        for (symbNb=charnum; symbNb <= *maxSVPtr; symbNb++)
            normalizedCounter[symbNb] = 0;
    }
    *maxSVPtr = charnum-1;

    ip += (bitCount+7)>>3;
    return ip-istart;
}